

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcGeometryShaderRendering.cpp
# Opt level: O3

int __thiscall
glcts::GeometryShaderRenderingLinesCase::verify
          (GeometryShaderRenderingLinesCase *this,EVP_PKEY_CTX *ctx,uchar *sig,size_t siglen,
          uchar *tbs,size_t tbslen)

{
  ostringstream *poVar1;
  undefined4 uVar2;
  undefined1 auVar3 [13];
  undefined1 auVar4 [13];
  undefined1 auVar5 [13];
  undefined1 auVar6 [13];
  undefined1 auVar7 [13];
  undefined1 auVar8 [13];
  undefined1 auVar9 [13];
  undefined1 auVar10 [13];
  uint uVar11;
  int iVar12;
  TestError *this_00;
  int iVar13;
  ulong uVar14;
  long lVar15;
  long lVar16;
  _func_int **pp_Var17;
  int iVar18;
  int iVar19;
  int iVar20;
  float fVar21;
  float fVar22;
  undefined1 auVar23 [16];
  float fVar24;
  undefined1 auVar25 [16];
  float fVar26;
  float fVar27;
  undefined1 auVar28 [16];
  float fVar29;
  uint single_rt_width;
  uint single_rt_height;
  uint rt_width;
  uint rt_height;
  uint local_230;
  uint local_22c;
  undefined1 local_228 [8];
  float fStack_220;
  float fStack_21c;
  undefined1 local_218 [8];
  float fStack_210;
  float fStack_20c;
  float local_204;
  GeometryShaderRenderingLinesCase *local_200;
  float local_1f8;
  undefined4 uStack_1f4;
  undefined4 uStack_1f0;
  undefined4 uStack_1ec;
  float fStack_1e4;
  int local_1e0 [2];
  undefined8 local_1d8;
  undefined8 uStack_1d0;
  undefined8 local_1c8;
  undefined8 uStack_1c0;
  undefined1 auStack_1b0 [120];
  ios_base aiStack_138 [264];
  
  local_1e0[1] = 0;
  local_1e0[0] = 0;
  local_22c = 0;
  local_230 = 0;
  pp_Var17 = (this->super_GeometryShaderRenderingCase).super_TestCaseBase.super_TestCase.
             super_TestNode._vptr_TestNode;
  uVar14 = 1;
  if (((uint)ctx & 0xfffffffd) == 1) {
    uVar11 = (*pp_Var17[5])(this,1);
    uVar14 = (ulong)uVar11;
    pp_Var17 = (this->super_GeometryShaderRenderingCase).super_TestCaseBase.super_TestCase.
               super_TestNode._vptr_TestNode;
  }
  (*pp_Var17[0xd])(this,uVar14,local_1e0,local_1e0 + 1);
  (*(this->super_GeometryShaderRenderingCase).super_TestCaseBase.super_TestCase.super_TestNode.
    _vptr_TestNode[0xd])(this,1,&local_230,&local_22c);
  iVar12 = local_1e0[0] * 4;
  iVar13 = *(int *)&(this->super_GeometryShaderRenderingCase).field_0x304;
  if (iVar13 == 0) {
    local_1f8 = (float)(local_230 - 1);
    iVar19 = (int)sig * local_22c + 1;
    iVar13 = 0;
    do {
      iVar20 = 1;
      iVar18 = 4;
      lVar15 = 0;
      do {
        if (lVar15 != 0) {
          fVar22 = (float)(int)lVar15;
          auVar23._0_4_ = fVar22 * -1.0;
          auVar23._4_4_ = fVar22 * 1.0;
          auVar23._8_4_ = fVar22 * 0.0;
          auVar23._12_4_ = fVar22 * 0.0;
          auVar23 = divps(auVar23,_DAT_01a44150);
          local_218._0_4_ = auVar23._0_4_ + 1.0;
          local_218._4_4_ = auVar23._4_4_ + 0.0;
          fStack_210 = auVar23._8_4_ + 0.0;
          fStack_20c = auVar23._12_4_ + 0.0;
          uVar2 = *(undefined4 *)((long)iVar18 + (uint)(iVar12 * iVar19) + siglen);
          uVar14 = (ulong)(ushort)uVar2 & 0xffffffffffff00ff;
          auVar6._8_4_ = 0;
          auVar6._0_8_ = uVar14;
          auVar6[0xc] = (char)((uint)uVar2 >> 0x18);
          auVar7[8] = (char)((uint)uVar2 >> 0x10);
          auVar7._0_8_ = uVar14;
          auVar7[9] = 0;
          auVar7._10_3_ = auVar6._10_3_;
          auVar10._5_8_ = 0;
          auVar10._0_5_ = auVar7._8_5_;
          auVar8[4] = (char)((uint)uVar2 >> 8);
          auVar8._0_4_ = (int)uVar14;
          auVar8[5] = 0;
          auVar8._6_7_ = SUB137(auVar10 << 0x40,6);
          auVar25._0_4_ = (float)(int)uVar14;
          auVar25._4_4_ = (float)auVar8._4_4_;
          auVar25._8_4_ = (float)auVar7._8_4_;
          auVar25._12_4_ = (float)(uint3)(auVar6._10_3_ >> 0x10);
          _local_228 = divps(auVar25,_DAT_01a9ab80);
          fVar21 = local_228._0_4_ - (float)local_218._0_4_;
          fVar22 = -fVar21;
          if (-fVar21 <= fVar21) {
            fVar22 = fVar21;
          }
          if (fVar22 <= 0.00390625) {
            fVar21 = local_228._4_4_ - (float)local_218._4_4_;
            fVar22 = -fVar21;
            if (-fVar21 <= fVar21) {
              fVar22 = fVar21;
            }
            if (fVar22 <= 0.00390625) {
              fVar21 = local_228._8_4_ - fStack_210;
              fVar22 = -fVar21;
              if (-fVar21 <= fVar21) {
                fVar22 = fVar21;
              }
              if (fVar22 <= 0.00390625) {
                fVar21 = local_228._12_4_ - fStack_20c;
                fVar22 = -fVar21;
                if (-fVar21 <= fVar21) {
                  fVar22 = fVar21;
                }
                if (fVar22 <= 0.00390625) goto LAB_00d14bf1;
              }
            }
          }
          auStack_1b0._0_8_ =
               ((this->super_GeometryShaderRenderingCase).super_TestCaseBase.super_TestCase.
                super_TestNode.m_testCtx)->m_log;
          poVar1 = (ostringstream *)(auStack_1b0 + 8);
          local_200 = this;
          std::__cxx11::ostringstream::ostringstream(poVar1);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)poVar1,"Rendered data at (",0x12);
          std::ostream::operator<<(poVar1,iVar20);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", ",2);
          std::ostream::operator<<(poVar1,iVar19);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,") ",2);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"equal (",7);
          std::ostream::_M_insert<double>((double)(float)local_228._0_4_);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", ",2);
          std::ostream::_M_insert<double>((double)(float)local_228._4_4_);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", ",2);
          std::ostream::_M_insert<double>((double)fStack_220);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", ",2);
          std::ostream::_M_insert<double>((double)fStack_21c);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,") ",2);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)poVar1,
                     "exceeds allowed epsilon when compared to reference data equal (",0x3f);
          std::ostream::_M_insert<double>((double)(float)local_218._0_4_);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", ",2);
          std::ostream::_M_insert<double>((double)(float)local_218._4_4_);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", ",2);
          std::ostream::_M_insert<double>((double)fStack_210);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", ",2);
          std::ostream::_M_insert<double>((double)fStack_20c);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,").",2);
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)auStack_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
          std::__cxx11::ostringstream::~ostringstream(poVar1);
          std::ios_base::~ios_base(aiStack_138);
          this_00 = (TestError *)__cxa_allocate_exception(0x38);
          tcu::TestError::TestError
                    (this_00,"Data comparison failed",(char *)0x0,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderRendering.cpp"
                     ,0xe4a);
          goto LAB_00d150d6;
        }
LAB_00d14bf1:
        lVar15 = lVar15 + 1;
        iVar20 = iVar20 + 6;
        iVar18 = iVar18 + 0x18;
      } while (lVar15 != 8);
      iVar13 = iVar13 + 1;
    } while (iVar13 != 4);
  }
  else {
    if (iVar13 != 1) {
      if (iVar13 == 2) {
        fVar21 = (float)((ulong)sig & 0xffffffff);
        iVar13 = 0;
        local_204 = 0.0;
        fVar27 = 1.0;
        fVar22 = fVar21;
        while( true ) {
          iVar20 = (int)(((local_204 + 1.0 + 0.5) / 3.0) * (float)local_230);
          iVar19 = (int)(((fVar22 + fVar21 + fVar21 + 0.5) / 3.0) * (float)local_22c);
          lVar15 = (uint)(iVar12 * iVar19) + siglen;
          lVar16 = (long)(iVar20 * 4);
          fVar29 = (float)*(byte *)(lVar16 + lVar15) / 255.0;
          local_218._0_4_ = (float)*(byte *)(lVar16 + 1 + lVar15) / 255.0;
          local_1f8 = (float)*(byte *)(lVar16 + 2 + lVar15) / 255.0;
          fVar26 = (float)*(byte *)(lVar16 + 3 + lVar15) / 255.0;
          fVar24 = fVar29 - fVar27;
          fVar22 = -fVar24;
          if (-fVar24 <= fVar24) {
            fVar22 = fVar24;
          }
          if (0.00390625 < fVar22) break;
          fVar24 = (float)local_218._0_4_ - local_204;
          fVar22 = -fVar24;
          if (-fVar24 <= fVar24) {
            fVar22 = fVar24;
          }
          if (0.00390625 < fVar22) break;
          fVar24 = local_1f8 - 0.0;
          fVar22 = -fVar24;
          if (-fVar24 <= fVar24) {
            fVar22 = fVar24;
          }
          if (0.00390625 < fVar22) break;
          fVar24 = fVar26 - 0.0;
          fVar22 = -fVar24;
          if (-fVar24 <= fVar24) {
            fVar22 = fVar24;
          }
          if (0.00390625 < fVar22) break;
          iVar13 = iVar13 + 1;
          if (iVar13 == 4) {
            return iVar12;
          }
          local_204 = 1.0;
          fVar27 = 0.0;
          fVar22 = fVar21 + 1.0;
        }
        local_228._0_4_ = fVar29;
        local_1c8 = CONCAT44(local_1c8._4_4_,fVar26);
        local_1d8 = CONCAT44(local_1d8._4_4_,fVar27);
        local_200 = (GeometryShaderRenderingLinesCase *)((ulong)local_200 & 0xffffffff00000000);
        fStack_1e4 = 0.0;
        auStack_1b0._0_8_ =
             ((this->super_GeometryShaderRenderingCase).super_TestCaseBase.super_TestCase.
              super_TestNode.m_testCtx)->m_log;
        poVar1 = (ostringstream *)(auStack_1b0 + 8);
        std::__cxx11::ostringstream::ostringstream(poVar1);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar1,"Rendered data at (",0x12);
        std::ostream::operator<<(poVar1,iVar20);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", ",2);
        std::ostream::operator<<(poVar1,iVar19);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,") ",2);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"equal (",7);
        std::ostream::_M_insert<double>((double)(float)local_228._0_4_);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", ",2);
        std::ostream::_M_insert<double>((double)(float)local_218._0_4_);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", ",2);
        std::ostream::_M_insert<double>((double)local_1f8);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", ",2);
        std::ostream::_M_insert<double>((double)(float)local_1c8);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,") ",2);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar1,
                   "exceeds allowed epsilon when compared to reference data equal (",0x3f);
        std::ostream::_M_insert<double>((double)(float)local_1d8);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", ",2);
        std::ostream::_M_insert<double>((double)local_204);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", ",2);
        std::ostream::_M_insert<double>((double)local_200._0_4_);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", ",2);
        std::ostream::_M_insert<double>((double)fStack_1e4);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,").",2);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)auStack_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream(poVar1);
        std::ios_base::~ios_base(aiStack_138);
        this_00 = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (this_00,"Data comparison failed",(char *)0x0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderRendering.cpp"
                   ,0xeb2);
      }
      else {
        this_00 = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (this_00,"Unsupported shader output type used",(char *)0x0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderRendering.cpp"
                   ,0xebb);
      }
LAB_00d150d6:
      __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
    }
    local_204 = (float)(local_230 - 2);
    iVar19 = (int)sig * local_22c + 1;
    iVar13 = 0;
    do {
      if (0 < (int)(local_230 - 6)) {
        iVar20 = 0;
        do {
          iVar18 = iVar20;
          if (local_230 == 6) {
            iVar18 = 0;
          }
          uVar2 = *(undefined4 *)((long)((iVar18 + 3) * 4) + (uint)(iVar19 * iVar12) + siglen);
          uVar14 = (ulong)(ushort)uVar2 & 0xffffffffffff00ff;
          auVar3._8_4_ = 0;
          auVar3._0_8_ = uVar14;
          auVar3[0xc] = (char)((uint)uVar2 >> 0x18);
          auVar4[8] = (char)((uint)uVar2 >> 0x10);
          auVar4._0_8_ = uVar14;
          auVar4[9] = 0;
          auVar4._10_3_ = auVar3._10_3_;
          auVar9._5_8_ = 0;
          auVar9._0_5_ = auVar4._8_5_;
          auVar5[4] = (char)((uint)uVar2 >> 8);
          auVar5._0_4_ = (int)uVar14;
          auVar5[5] = 0;
          auVar5._6_7_ = SUB137(auVar9 << 0x40,6);
          auVar28._0_4_ = (float)(int)uVar14;
          auVar28._4_4_ = (float)auVar5._4_4_;
          auVar28._8_4_ = (float)auVar4._8_4_;
          auVar28._12_4_ = (float)(uint3)(auVar3._10_3_ >> 0x10);
          _local_228 = divps(auVar28,_DAT_01a9ab80);
          fVar21 = local_228._0_4_ - 0.5;
          fVar22 = -fVar21;
          if (-fVar21 <= fVar21) {
            fVar22 = fVar21;
          }
          if (0.00390625 < fVar22) {
LAB_00d14c27:
            local_1f8 = 0.5;
            uStack_1f4 = 0x3f000000;
            uStack_1f0 = 0x3f000000;
            uStack_1ec = 0x3f000000;
            fStack_20c = 0.0;
            _local_218 = ZEXT812(0x3f0000003f000000);
            local_1c8 = 0;
            uStack_1c0 = 0;
            local_1d8 = 0;
            uStack_1d0 = 0;
            auStack_1b0._0_8_ =
                 ((this->super_GeometryShaderRenderingCase).super_TestCaseBase.super_TestCase.
                  super_TestNode.m_testCtx)->m_log;
            poVar1 = (ostringstream *)(auStack_1b0 + 8);
            local_200 = this;
            std::__cxx11::ostringstream::ostringstream(poVar1);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)poVar1,"Rendered data at (",0x12);
            std::ostream::operator<<(poVar1,iVar18 + 3);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", ",2);
            std::ostream::operator<<(poVar1,iVar19);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,") ",2);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"equal (",7);
            std::ostream::_M_insert<double>((double)(float)local_228._0_4_);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", ",2);
            std::ostream::_M_insert<double>((double)(float)local_228._4_4_);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", ",2);
            std::ostream::_M_insert<double>((double)fStack_220);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", ",2);
            std::ostream::_M_insert<double>((double)fStack_21c);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,") ",2);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)poVar1,
                       "exceeds allowed epsilon when compared to reference data equal (",0x3f);
            std::ostream::_M_insert<double>((double)(float)local_218._0_4_);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", ",2);
            std::ostream::_M_insert<double>((double)local_1f8);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", ",2);
            std::ostream::_M_insert<double>((double)(float)local_1c8);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", ",2);
            std::ostream::_M_insert<double>((double)(float)local_1d8);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,").",2);
            tcu::MessageBuilder::operator<<
                      ((MessageBuilder *)auStack_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
            std::__cxx11::ostringstream::~ostringstream(poVar1);
            std::ios_base::~ios_base(aiStack_138);
            this_00 = (TestError *)__cxa_allocate_exception(0x38);
            tcu::TestError::TestError
                      (this_00,"Data comparison failed",(char *)0x0,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderRendering.cpp"
                       ,0xdc4);
            goto LAB_00d150d6;
          }
          fVar21 = local_228._4_4_ - 0.5;
          fVar22 = -fVar21;
          if (-fVar21 <= fVar21) {
            fVar22 = fVar21;
          }
          if (0.00390625 < fVar22) goto LAB_00d14c27;
          fVar21 = local_228._8_4_ - 0.0;
          fVar22 = -fVar21;
          if (-fVar21 <= fVar21) {
            fVar22 = fVar21;
          }
          if (0.00390625 < fVar22) goto LAB_00d14c27;
          fVar21 = local_228._12_4_ - 0.0;
          fVar22 = -fVar21;
          if (-fVar21 <= fVar21) {
            fVar22 = fVar21;
          }
          if (0.00390625 < fVar22) goto LAB_00d14c27;
          iVar20 = iVar20 + 1;
        } while (local_230 - 6 != iVar20);
      }
      iVar13 = iVar13 + 1;
    } while (iVar13 != 4);
  }
  return iVar12;
}

Assistant:

void GeometryShaderRenderingLinesCase::verify(_draw_call_type drawcall_type, unsigned int instance_id,
											  const unsigned char* data)
{
	const float  epsilon		  = 1.0f / 256.0f;
	unsigned int rt_height		  = 0;
	unsigned int rt_width		  = 0;
	unsigned int single_rt_height = 0;
	unsigned int single_rt_width  = 0;

	if (drawcall_type == DRAW_CALL_TYPE_GL_DRAW_ARRAYS_INSTANCED ||
		drawcall_type == DRAW_CALL_TYPE_GL_DRAW_ELEMENTS_INSTANCED)
	{
		getRenderTargetSize(getAmountOfDrawInstances(), &rt_width, &rt_height);
	}
	else
	{
		getRenderTargetSize(1, &rt_width, &rt_height);
	}

	getRenderTargetSize(1, &single_rt_width, &single_rt_height);

	/* Verification is output type-specific */
	const unsigned int row_width = rt_width * 4 /* components */;

	switch (m_output_type)
	{
	case SHADER_OUTPUT_TYPE_LINE_STRIP:
	{
		/* The test renders a rectangle outline with 3 line segments for each edge.
		 * The verification checks color of each edge's middle line segment.
		 *
		 * Corners are skipped to keep the implementation simple. */
		for (unsigned int n_edge = 0; n_edge < 4 /* edges */; ++n_edge)
		{
			/* Determine edge-specific properties:
			 *
			 * Edge 0 - top edge;
			 * Edge 1 - right edge;
			 * Edge 2 - bottom edge;
			 * Edge 3 - left edge.
			 *
			 **/
			int		  end_x = 0;
			int		  end_y = 0;
			tcu::Vec4 expected_rgba;
			int		  start_x = 0;
			int		  start_y = 0;

			switch (n_edge)
			{
			case 0:
			{
				/* Top edge */
				start_x = 3;								  /* skip the corner */
				start_y = 1 + instance_id * single_rt_height; /* middle segment */

				end_x = single_rt_width - 3; /* skip the corner */
				end_y = start_y;

				expected_rgba = tcu::Vec4(1.0f, 0.0f, 0.0f, 0.0f) * tcu::Vec4(0.5f) +
								tcu::Vec4(0.0f, 1.0f, 0.0f, 0.0f) * tcu::Vec4(0.5f);

				break;
			}

			case 1:
			{
				/* Right edge */
				start_x = single_rt_width - 2;				  /* middle segment */
				start_y = 3 + instance_id * single_rt_height; /* skip the corner */

				end_x = start_x;
				end_y = start_y + single_rt_height - 6; /* skip the corners */

				expected_rgba = tcu::Vec4(0.0f, 1.0f, 0.0f, 0.0f) * tcu::Vec4(0.5f) +
								tcu::Vec4(0.0f, 0.0f, 1.0f, 0.0f) * tcu::Vec4(0.5f);

				break;
			}

			case 2:
			{
				/* Bottom edge */
				start_x = 3;													 /* skip the corner */
				start_y = single_rt_height - 3 + instance_id * single_rt_height; /* middle segment */

				end_x = single_rt_width - 6; /* skip the corners */
				end_y = start_y;

				expected_rgba = tcu::Vec4(0.0f, 0.0f, 1.0f, 0.0f) * tcu::Vec4(0.5f) +
								tcu::Vec4(0.0f, 0.0f, 0.0f, 1.0f) * tcu::Vec4(0.5f);

				break;
			}

			case 3:
			{
				/* Left edge */
				start_x = 1;								  /* middle segment */
				start_y = 3 + instance_id * single_rt_height; /* skip the corner */

				end_x = start_x;
				end_y = start_y + single_rt_height - 6; /* skip the corners */

				expected_rgba = tcu::Vec4(0.0f, 0.0f, 0.0f, 1.0f) * tcu::Vec4(0.5f) +
								tcu::Vec4(1.0f, 0.0f, 0.0f, 0.0f) * tcu::Vec4(0.5f);

				break;
			}

			default:
			{
				TCU_FAIL("Unrecognized edge index");
			}
			} /* switch(n_edge) */

			/* Move over the edge and make sure the rendered pixels are valid */
			int dx		 = (end_x != start_x) ? 1 : 0;
			int dy		 = (end_y != start_y) ? 1 : 0;
			int n_pixels = (end_x - start_x) + (end_y - start_y);

			for (int n_pixel = 0; n_pixel < n_pixels; ++n_pixel)
			{
				int cur_x = start_x + n_pixel * dx;
				int cur_y = start_y + n_pixel * dy;

				/* Calculate expected and rendered pixel color */
				const unsigned char* read_data		  = data + cur_y * row_width + cur_x * 4 /* components */;
				float				 rendered_rgba[4] = { 0 };

				for (unsigned int n_channel = 0; n_channel < 4 /* RGBA */; ++n_channel)
				{
					rendered_rgba[n_channel] = float(read_data[n_channel]) / 255.0f;
				}

				/* Compare the data */
				if (de::abs(rendered_rgba[0] - expected_rgba[0]) > epsilon ||
					de::abs(rendered_rgba[1] - expected_rgba[1]) > epsilon ||
					de::abs(rendered_rgba[2] - expected_rgba[2]) > epsilon ||
					de::abs(rendered_rgba[3] - expected_rgba[3]) > epsilon)
				{
					m_testCtx.getLog() << tcu::TestLog::Message << "Rendered data at (" << cur_x << ", " << cur_y
									   << ") "
									   << "equal (" << rendered_rgba[0] << ", " << rendered_rgba[1] << ", "
									   << rendered_rgba[2] << ", " << rendered_rgba[3] << ") "
									   << "exceeds allowed epsilon when compared to reference data equal ("
									   << expected_rgba[0] << ", " << expected_rgba[1] << ", " << expected_rgba[2]
									   << ", " << expected_rgba[3] << ")." << tcu::TestLog::EndMessage;

					TCU_FAIL("Data comparison failed");
				} /* if (data comparison failed) */
			}	 /* for (all points) */
		}		  /* for (all edges) */

		break;
	} /* case SHADER_OUTPUT_TYPE_LINE_STRIP: */

	case SHADER_OUTPUT_TYPE_POINTS:
	{
		/* Verify centers of the points generated by geometry shader */
		int dx = 0;
		int dy = 0;

		bool ignore_first_point = false;
		int  start_x			= 0;
		int  start_y			= 0;

		tcu::Vec4 end_color;
		tcu::Vec4 start_color;

		for (unsigned int n_edge = 0; n_edge < 4 /* edges */; ++n_edge)
		{
			/* Determine edge-specific properties:
			 *
			 * Edge 0 - top edge; NOTE: the test should skip point at (1px, 1px) as it is overwritten by
			 *          edge 3!
			 * Edge 1 - right edge;
			 * Edge 2 - bottom edge;
			 * Edge 3 - left edge.
			 *
			 **/
			switch (n_edge)
			{
			case 0:
			{
				dx				   = 6;
				dy				   = 0;
				ignore_first_point = true;
				start_x			   = 1;
				start_y			   = 1 + instance_id * single_rt_height;

				end_color   = tcu::Vec4(0.0f, 1.0f, 0.0f, 0.0f);
				start_color = tcu::Vec4(1.0f, 0.0f, 0.0f, 0.0f);

				break;
			}

			case 1:
			{
				dx				   = 0;
				dy				   = 6;
				ignore_first_point = false;
				start_x			   = single_rt_width - 1;
				start_y			   = 1 + instance_id * single_rt_height;

				end_color   = tcu::Vec4(0.0f, 0.0f, 1.0f, 0.0f);
				start_color = tcu::Vec4(0.0f, 1.0f, 0.0f, 0.0f);

				break;
			}

			case 2:
			{
				dx				   = -6;
				dy				   = 0;
				ignore_first_point = false;
				start_x			   = single_rt_width - 1;
				start_y			   = single_rt_height - 1 + instance_id * single_rt_height;

				end_color   = tcu::Vec4(0.0f, 0.0f, 0.0f, 1.0f);
				start_color = tcu::Vec4(0.0f, 0.0f, 1.0f, 0.0f);

				break;
			}

			case 3:
			{
				dx				   = 0;
				dy				   = -6;
				ignore_first_point = false;
				start_x			   = 1;
				start_y			   = single_rt_height - 1 + instance_id * single_rt_height;

				end_color   = tcu::Vec4(1.0f, 0.0f, 0.0f, 0.0f);
				start_color = tcu::Vec4(0.0f, 0.0f, 0.0f, 1.0f);

				break;
			}

			default:
			{
				TCU_FAIL("Unrecognized edge index");
			}
			} /* switch(n_edge) */

			for (unsigned int n_point = 0; n_point < 8 /* points */; ++n_point)
			{
				int cur_x = start_x + n_point * dx;
				int cur_y = start_y + n_point * dy;

				/* Skip the iteration if we're dealing with a first point, for which
				 * the comparison should be skipped */
				if (ignore_first_point && n_point == 0)
				{
					continue;
				}

				/* Calculate expected and rendered pixel color */
				const unsigned char* read_data		   = data + cur_y * row_width + cur_x * 4 /* components */;
				float				 reference_rgba[4] = { 0 };
				float				 rendered_rgba[4]  = { 0 };

				for (unsigned int n_channel = 0; n_channel < 4 /* RGBA */; ++n_channel)
				{
					reference_rgba[n_channel] = start_color[n_channel] +
												(end_color[n_channel] - start_color[n_channel]) * float(n_point) / 7.0f;
					rendered_rgba[n_channel] = (float)(read_data[n_channel]) / 255.0f;
				}

				/* Compare the data */
				if (de::abs(rendered_rgba[0] - reference_rgba[0]) > epsilon ||
					de::abs(rendered_rgba[1] - reference_rgba[1]) > epsilon ||
					de::abs(rendered_rgba[2] - reference_rgba[2]) > epsilon ||
					de::abs(rendered_rgba[3] - reference_rgba[3]) > epsilon)
				{
					m_testCtx.getLog() << tcu::TestLog::Message << "Rendered data at (" << cur_x << ", " << cur_y
									   << ") "
									   << "equal (" << rendered_rgba[0] << ", " << rendered_rgba[1] << ", "
									   << rendered_rgba[2] << ", " << rendered_rgba[3] << ") "
									   << "exceeds allowed epsilon when compared to reference data equal ("
									   << reference_rgba[0] << ", " << reference_rgba[1] << ", " << reference_rgba[2]
									   << ", " << reference_rgba[3] << ")." << tcu::TestLog::EndMessage;

					TCU_FAIL("Data comparison failed");
				} /* if (data comparison failed) */

			} /* for (all points) */
		}	 /* for (all edges) */

		/* Done */
		break;
	} /* case SHADER_OUTPUT_TYPE_POINTS: */

	case SHADER_OUTPUT_TYPE_TRIANGLE_STRIP:
	{
		/* The test renders four triangles - two vertices are taken from each edge and the third
		 * one is set at (0, 0, 0, 1) (screen-space). The rendering output is verified by
		 * sampling centroids off each triangle */
		for (unsigned int n_edge = 0; n_edge < 4 /* edges */; ++n_edge)
		{
			/* Determine edge-specific properties */
			tcu::Vec2 centroid;
			tcu::Vec4 reference_rgba;
			tcu::Vec2 v1;
			tcu::Vec2 v2;
			tcu::Vec2 v3 = tcu::Vec2(0.5f, 0.5f + float(instance_id));

			switch (n_edge)
			{
			case 0:
			{
				/* Top edge */
				v1 = tcu::Vec2(0.0f, float(instance_id) + 0.0f);
				v2 = tcu::Vec2(1.0f, float(instance_id) + 0.0f);

				reference_rgba = tcu::Vec4(1.0f, 0.0f, 0.0f, 0.0f);

				break;
			}

			case 1:
			{
				/* Right edge */
				v1 = tcu::Vec2(1.0f, float(instance_id) + 0.0f);
				v2 = tcu::Vec2(1.0f, float(instance_id) + 1.0f);

				reference_rgba = tcu::Vec4(0.0f, 1.0f, 0.0f, 0.0f);

				break;
			}

			case 2:
			{
				/* Bottom edge */
				v1 = tcu::Vec2(0.0f, float(instance_id) + 1.0f);
				v2 = tcu::Vec2(1.0f, float(instance_id) + 1.0f);

				reference_rgba = tcu::Vec4(0.0f, 0.0f, 1.0f, 0.0f);

				break;
			}

			case 3:
			{
				/* Left edge */
				v1 = tcu::Vec2(0.0f, float(instance_id) + 0.0f);
				v2 = tcu::Vec2(0.0f, float(instance_id) + 1.0f);

				reference_rgba = tcu::Vec4(0.0f, 0.0f, 0.0f, 1.0f);

				break;
			}

			default:
			{
				TCU_FAIL("Unrecognized edge index");
			}
			} /* switch (n_edge) */

			/* Calculate centroid of the triangle. */
			centroid[0] = (v1[0] + v2[0] + v3[0]) / 3.0f;
			centroid[1] = (v1[1] + v2[1] + v3[1]) / 3.0f;

			/* Retrieve the sample */
			int centroid_xy[2] = { int(centroid[0] * float(single_rt_width)),
								   int(centroid[1] * float(single_rt_height)) };
			const unsigned char* rendered_rgba_ubyte =
				data + centroid_xy[1] * row_width + centroid_xy[0] * 4 /* components */;
			const float rendered_rgba_float[] = {
				float(rendered_rgba_ubyte[0]) / 255.0f, float(rendered_rgba_ubyte[1]) / 255.0f,
				float(rendered_rgba_ubyte[2]) / 255.0f, float(rendered_rgba_ubyte[3]) / 255.0f,
			};

			/* Compare the reference and rendered pixels */
			if (de::abs(rendered_rgba_float[0] - reference_rgba[0]) > epsilon ||
				de::abs(rendered_rgba_float[1] - reference_rgba[1]) > epsilon ||
				de::abs(rendered_rgba_float[2] - reference_rgba[2]) > epsilon ||
				de::abs(rendered_rgba_float[3] - reference_rgba[3]) > epsilon)
			{
				m_testCtx.getLog() << tcu::TestLog::Message << "Rendered data at (" << centroid_xy[0] << ", "
								   << centroid_xy[1] << ") "
								   << "equal (" << rendered_rgba_float[0] << ", " << rendered_rgba_float[1] << ", "
								   << rendered_rgba_float[2] << ", " << rendered_rgba_float[3] << ") "
								   << "exceeds allowed epsilon when compared to reference data equal ("
								   << reference_rgba[0] << ", " << reference_rgba[1] << ", " << reference_rgba[2]
								   << ", " << reference_rgba[3] << ")." << tcu::TestLog::EndMessage;

				TCU_FAIL("Data comparison failed");
			} /* if (data comparison failed) */
		}	 /* for (all edges) */

		break;
	}

	default:
	{
		TCU_FAIL("Unsupported shader output type used");
	}
	} /* switch (m_output_type) */
}